

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfileio.hpp
# Opt level: O2

bool __thiscall
soplex::SPxSolverBase<double>::writeBasisFile
          (SPxSolverBase<double> *this,char *filename,NameSet *rowNames,NameSet *colNames,
          bool cpxFormat)

{
  uint uVar1;
  ofstream file;
  uint auStack_208 [120];
  
  std::ofstream::ofstream(&file,filename,_S_out);
  uVar1 = *(uint *)((long)auStack_208 + *(long *)(_file + -0x18));
  if ((uVar1 & 5) == 0) {
    (*(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase[2])
              (&this->super_SPxBasisBase<double>,&file,rowNames,colNames,0);
  }
  std::ofstream::~ofstream(&file);
  return (uVar1 & 5) == 0;
}

Assistant:

bool SPxSolverBase<R>::writeBasisFile
(const char*    filename,
 const NameSet* rowNames,
 const NameSet* colNames,
 const bool cpxFormat) const
{
   std::ofstream file(filename);

   if(!file)
      return false;

   this->writeBasis(file, rowNames, colNames);
   return true;
}